

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O1

bool xray_re::xr_file_system::file_exist(char *path)

{
  char cVar1;
  bool bVar2;
  CPath p;
  path local_38;
  char *local_10;
  
  local_10 = path;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_38,&local_10,auto_format);
  do {
    if (*local_38._M_pathname._M_dataplus._M_p == '\\') {
      *local_38._M_pathname._M_dataplus._M_p = '/';
    }
    cVar1 = *local_38._M_pathname._M_dataplus._M_p;
    local_38._M_pathname._M_dataplus._M_p = local_38._M_pathname._M_dataplus._M_p + 1;
  } while (cVar1 != '\0');
  cVar1 = std::filesystem::status(&local_38);
  bVar2 = false;
  if ((cVar1 != '\0') && (bVar2 = false, cVar1 != -1)) {
    cVar1 = std::filesystem::status(&local_38);
    bVar2 = cVar1 == '\x01';
  }
  std::filesystem::__cxx11::path::~path(&local_38);
  return bVar2;
}

Assistant:

bool xr_file_system::file_exist(const char* path)
{
CPath p(path);

	p.make_preferred();

	return fs::exists(p) && fs::is_regular_file(p);
}